

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

string * __thiscall
pbrt::ParallelForLoop1D::ToString_abi_cxx11_(string *__return_storage_ptr__,ParallelForLoop1D *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<long_const&,long_const&,int_const&>
            (__return_storage_ptr__,"[ ParallelForLoop1D nextIndex: %d maxIndex: %d chunkSize: %d ]"
             ,&this->nextIndex,&this->maxIndex,&this->chunkSize);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ ParallelForLoop1D nextIndex: %d maxIndex: %d "
                            "chunkSize: %d ]",
                            nextIndex, maxIndex, chunkSize);
    }